

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O3

void __thiscall
slang::ast::ConditionalExpression::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
          (ConditionalExpression *this,SequenceMethodExprVisitor *visitor)

{
  size_t sVar1;
  Expression *this_00;
  Condition *cond;
  pointer pCVar2;
  pointer pCVar3;
  
  sVar1 = (this->conditions)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pCVar2 = (this->conditions)._M_ptr;
    pCVar3 = pCVar2 + sVar1;
    do {
      this_00 = (pCVar2->expr).ptr;
      Expression::
      visitExpression<slang::ast::Expression_const,slang::ast::builtins::SequenceMethodExprVisitor&>
                (this_00,this_00,visitor);
      if (pCVar2->pattern != (Pattern *)0x0) {
        Pattern::visit<slang::ast::builtins::SequenceMethodExprVisitor>(pCVar2->pattern,visitor);
      }
      pCVar2 = pCVar2 + 1;
    } while (pCVar2 != pCVar3);
  }
  Expression::
  visitExpression<slang::ast::Expression_const,slang::ast::builtins::SequenceMethodExprVisitor&>
            (this->left_,this->left_,visitor);
  Expression::
  visitExpression<slang::ast::Expression_const,slang::ast::builtins::SequenceMethodExprVisitor&>
            (this->right_,this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& cond : conditions) {
            cond.expr->visit(visitor);
            if (cond.pattern)
                cond.pattern->visit(visitor);
        }

        left().visit(visitor);
        right().visit(visitor);
    }